

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

void ps_parser_to_token_array
               (PS_Parser parser,T1_Token tokens,FT_UInt max_tokens,FT_Int *pnum_tokens)

{
  FT_Byte *pFVar1;
  FT_Byte *pFVar2;
  undefined1 local_78 [8];
  T1_TokenRec token;
  T1_Token limit;
  T1_Token cur;
  FT_Byte *old_limit;
  FT_Byte *old_cursor;
  T1_TokenRec master;
  FT_Int *pnum_tokens_local;
  FT_UInt max_tokens_local;
  T1_Token tokens_local;
  PS_Parser parser_local;
  
  *pnum_tokens = -1;
  master._16_8_ = pnum_tokens;
  ps_parser_to_token(parser,(T1_Token)&old_cursor);
  if ((int)master.limit == 3) {
    pFVar1 = parser->cursor;
    pFVar2 = parser->limit;
    token._16_8_ = tokens + max_tokens;
    parser->cursor = old_cursor + 1;
    parser->limit = master.start + -1;
    limit = tokens;
    while ((parser->cursor < parser->limit &&
           (ps_parser_to_token(parser,(T1_Token)local_78), (int)token.limit != 0))) {
      if ((tokens != (T1_Token)0x0) && (limit < (ulong)token._16_8_)) {
        limit->start = (FT_Byte *)local_78;
        limit->limit = token.start;
        *(ulong *)&limit->type = CONCAT44(token.limit._4_4_,(int)token.limit);
      }
      limit = limit + 1;
    }
    *(int *)master._16_8_ = (int)(((long)limit - (long)tokens) / 0x18);
    parser->cursor = pFVar1;
    parser->limit = pFVar2;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_parser_to_token_array( PS_Parser  parser,
                            T1_Token   tokens,
                            FT_UInt    max_tokens,
                            FT_Int*    pnum_tokens )
  {
    T1_TokenRec  master;


    *pnum_tokens = -1;

    /* this also handles leading whitespace */
    ps_parser_to_token( parser, &master );

    if ( master.type == T1_TOKEN_TYPE_ARRAY )
    {
      FT_Byte*  old_cursor = parser->cursor;
      FT_Byte*  old_limit  = parser->limit;
      T1_Token  cur        = tokens;
      T1_Token  limit      = cur + max_tokens;


      /* don't include outermost delimiters */
      parser->cursor = master.start + 1;
      parser->limit  = master.limit - 1;

      while ( parser->cursor < parser->limit )
      {
        T1_TokenRec  token;


        ps_parser_to_token( parser, &token );
        if ( !token.type )
          break;

        if ( tokens && cur < limit )
          *cur = token;

        cur++;
      }

      *pnum_tokens = (FT_Int)( cur - tokens );

      parser->cursor = old_cursor;
      parser->limit  = old_limit;
    }
  }